

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O0

errr Term_locate(int *x,int *y)

{
  int *y_local;
  int *x_local;
  
  *x = Term->scr->cx;
  *y = Term->scr->cy;
  x_local._4_4_ = (uint)((Term->scr->cu & 1U) != 0);
  return x_local._4_4_;
}

Assistant:

errr Term_locate(int *x, int *y)
{
	/* Access the cursor */
	(*x) = Term->scr->cx;
	(*y) = Term->scr->cy;

	/* Warn about "useless" cursor */
	if (Term->scr->cu) return (1);

	/* Success */
	return (0);
}